

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_rolemaskproxymodel.cpp
# Opt level: O3

QAbstractItemModel * createListModel(QObject *parent)

{
  QStringListModel *this;
  QArrayDataPointer<QString> local_a8;
  QString local_88;
  QString local_70;
  QString local_58;
  QString local_40;
  QString local_28;
  
  this = (QStringListModel *)operator_new(0x28);
  local_a8.size = 0;
  local_a8.d = (Data *)0x0;
  local_a8.ptr = (QString *)0x0;
  local_28.d.d = (Data *)0x0;
  local_28.d.ptr = L"1";
  local_28.d.size = 1;
  QtPrivate::QMovableArrayOps<QString>::emplace<QString>
            ((QMovableArrayOps<QString> *)&local_a8,0,&local_28);
  local_40.d.d = (Data *)0x0;
  local_40.d.ptr = L"2";
  local_40.d.size = 1;
  QtPrivate::QMovableArrayOps<QString>::emplace<QString>
            ((QMovableArrayOps<QString> *)&local_a8,local_a8.size,&local_40);
  local_58.d.d = (Data *)0x0;
  local_58.d.ptr = L"3";
  local_58.d.size = 1;
  QtPrivate::QMovableArrayOps<QString>::emplace<QString>
            ((QMovableArrayOps<QString> *)&local_a8,local_a8.size,&local_58);
  local_70.d.d = (Data *)0x0;
  local_70.d.ptr = L"4";
  local_70.d.size = 1;
  QtPrivate::QMovableArrayOps<QString>::emplace<QString>
            ((QMovableArrayOps<QString> *)&local_a8,local_a8.size,&local_70);
  local_88.d.d = (Data *)0x0;
  local_88.d.ptr = L"5";
  local_88.d.size = 1;
  QtPrivate::QMovableArrayOps<QString>::emplace<QString>
            ((QMovableArrayOps<QString> *)&local_a8,local_a8.size,&local_88);
  QStringListModel::QStringListModel(this,(QList *)&local_a8,parent);
  if (&(local_88.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_88.d.d)->super_QArrayData,2,8);
    }
  }
  if (&(local_70.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_70.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_70.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_70.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_70.d.d)->super_QArrayData,2,8);
    }
  }
  if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,8);
    }
  }
  if (&(local_40.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_40.d.d)->super_QArrayData,2,8);
    }
  }
  if (&(local_28.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_28.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_28.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_28.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_28.d.d)->super_QArrayData,2,8);
    }
  }
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_a8);
  return (QAbstractItemModel *)this;
}

Assistant:

QAbstractItemModel *createListModel(QObject *parent)
{
    return new QStringListModel(
            QStringList() << QStringLiteral("1") << QStringLiteral("2") << QStringLiteral("3") << QStringLiteral("4") << QStringLiteral("5"), parent);
}